

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex00m1.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  istream *this;
  ostream *poVar2;
  iterator __begin1;
  int *piVar3;
  int iVar4;
  int *piVar5;
  Comp c;
  int x;
  int iStack_84;
  int M;
  int N;
  vector<int,_std::allocator<int>_> time;
  value_type local_58;
  priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
  wait;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105170) = 0;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&N);
  std::istream::operator>>(this,&M);
  time.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  time.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  time.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
  ::priority_queue(&wait,&c,(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            &time);
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&time);
  for (iVar4 = 0; iVar4 < N; iVar4 = iVar4 + 1) {
    if (iVar4 == M) goto LAB_001013f7;
    std::istream::operator>>((istream *)&std::cin,&x);
    time.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(x,x);
    std::
    priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
    ::push(&wait,(value_type *)&time);
    std::operator<<((ostream *)&std::cout,"0\n");
  }
  time.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  time.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  time.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  iVar4 = 1;
  piVar3 = (int *)0x0;
  piVar5 = (int *)0x0;
  iVar1 = N;
  while ((ulong)((long)piVar5 - (long)piVar3 >> 2) < (ulong)((long)M - (long)iVar1)) {
    if ((wait.c.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
         _M_impl.super__Vector_impl_data._M_start)->first <= iVar4) {
      _x = *wait.c.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
      std::
      priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
      ::pop(&wait);
      std::vector<int,std::allocator<int>>::emplace_back<int&>
                ((vector<int,std::allocator<int>> *)&time,&x);
      local_58.first = x + iStack_84;
      local_58.second = iStack_84;
      std::
      priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
      ::push(&wait,&local_58);
      piVar3 = time.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      piVar5 = time.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      iVar1 = N;
    }
    iVar4 = iVar4 + 1;
  }
  for (; piVar3 != piVar5; piVar3 = piVar3 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar3);
    std::operator<<(poVar2,"\n");
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&time.super__Vector_base<int,_std::allocator<int>_>);
LAB_001013f7:
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&wait);
  return 0;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);

    int N, M;
    cin >> N >> M;
    Comp c;
    priority_queue<pii, vector<pii>, Comp> wait(c);
    for (int i = 0; i < N; ++i) {
        if (i == M) return 0;
        int x;
        cin >> x;
        wait.push(make_pair(x, x));
        cout << "0\n";
    }
    vector<int> time;
    int i = 1;
    while (time.size() < (size_t)M-N) {
        if (wait.top().first <= i) {
            auto top = wait.top();
            wait.pop();
            time.emplace_back(top.first);
            wait.push(make_pair(top.first + top.second,
                                top.second));
        }
        ++i;
    }

    for (auto &e : time) {
        cout << e << "\n";
    }
}